

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O2

void __thiscall imrt::Plan::printSolution(Plan *this)

{
  Station *this_00;
  int s;
  int i;
  
  for (i = 0; i < this->n_stations; i = i + 1) {
    this_00 = get_station(this,i);
    Station::printAperture(this_00,i);
  }
  return;
}

Assistant:

void Plan::printSolution () {
    Station *st;
    for (int s=0; s < n_stations; s++) {
      st = get_station(s);
      st->printAperture(s);
    }
  }